

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportBuildFileGenerator::SetImportLocationProperty
          (cmExportBuildFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  cmMakefile *pcVar1;
  pointer ppcVar2;
  bool bVar3;
  TargetType TVar4;
  string *__rhs;
  mapped_type *pmVar5;
  cmValue cVar6;
  pointer ppcVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view separator;
  string obj_dir;
  string prop;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  cmMakefile *local_70;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar1 = target->Makefile;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == OBJECT_LIBRARY) {
    local_b0.field_2._8_8_ = (suffix->_M_dataplus)._M_p;
    local_b0.field_2._M_allocated_capacity = suffix->_M_string_length;
    local_b0._M_dataplus._M_p = (pointer)0x10;
    local_b0._M_string_length = 0x6e986a;
    views._M_len = 2;
    views._M_array = (iterator)&local_b0;
    cmCatViews_abi_cxx11_(&local_90,views);
    local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetObjectSources(target,&local_68,config);
    local_70 = (cmMakefile *)properties;
    cmGeneratorTarget::GetObjectDirectory(&local_b0,target,config);
    ppcVar2 = local_68.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar7 = local_68.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        __rhs = cmGeneratorTarget::GetObjectName_abi_cxx11_(target,*ppcVar7);
        std::operator+(&local_d0,&local_b0,__rhs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   &local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 != ppcVar2);
    }
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin(&local_d0,&local_48,separator,(string_view)ZEXT816(0));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_70,&local_90);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
  }
  else {
    local_b0.field_2._8_8_ = (suffix->_M_dataplus)._M_p;
    local_b0.field_2._M_allocated_capacity = suffix->_M_string_length;
    local_b0._M_dataplus._M_p = &DAT_00000011;
    local_b0._M_string_length = 0x6e3d6a;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_b0;
    local_70 = pcVar1;
    cmCatViews_abi_cxx11_(&local_90,views_00);
    local_b0._M_string_length = 0;
    local_b0.field_2._M_allocated_capacity =
         local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    bVar3 = cmGeneratorTarget::IsAppBundleOnApple(target);
    if (bVar3) {
      cmGeneratorTarget::GetFullPath(&local_d0,target,config,RuntimeBinaryArtifact,false);
    }
    else {
      cmGeneratorTarget::GetFullPath(&local_d0,target,config,RuntimeBinaryArtifact,true);
    }
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    bVar3 = cmGeneratorTarget::HasImportLibrary(target,config);
    if (!bVar3) {
      return;
    }
    local_b0.field_2._8_8_ = (suffix->_M_dataplus)._M_p;
    local_b0.field_2._M_allocated_capacity = suffix->_M_string_length;
    local_b0._M_dataplus._M_p = (pointer)0xf;
    local_b0._M_string_length = 0x6e97d5;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&local_b0;
    cmCatViews_abi_cxx11_(&local_90,views_01);
    cmGeneratorTarget::GetFullPath(&local_b0,target,config,ImportLibraryArtifact,false);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
    cVar6 = cmMakefile::GetDefinition(local_70,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      cmGeneratorTarget::GetImplibGNUtoMS
                (target,config,&local_b0,&local_b0,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmExportBuildFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<cmSourceFile const*> objectSources;
    target->GetObjectSources(objectSources, config);
    std::string const obj_dir = target->GetObjectDirectory(config);
    std::vector<std::string> objects;
    for (cmSourceFile const* sf : objectSources) {
      const std::string& obj = target->GetObjectName(sf);
      objects.push_back(obj_dir + obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
  } else {
    // Add the main target file.
    {
      std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);
      std::string value;
      if (target->IsAppBundleOnApple()) {
        value =
          target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
      } else {
        value = target->GetFullPath(config,
                                    cmStateEnums::RuntimeBinaryArtifact, true);
      }
      properties[prop] = value;
    }

    // Add the import library for windows DLLs.
    if (target->HasImportLibrary(config)) {
      std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);
      std::string value =
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact);
      if (mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
        target->GetImplibGNUtoMS(config, value, value,
                                 "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      }
      properties[prop] = value;
    }
  }
}